

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

uint32 __thiscall google::protobuf::io::CodedInputStream::ReadTagFallback(CodedInputStream *this)

{
  uint32 uVar1;
  int iVar2;
  uint uVar4;
  byte *pbVar5;
  int iVar3;
  
  pbVar5 = this->buffer_;
  iVar3 = (int)this->buffer_end_;
  iVar2 = iVar3 - (int)pbVar5;
  if ((iVar2 < 10) && ((iVar2 < 1 || ((char)this->buffer_end_[-1] < '\0')))) {
    if ((iVar3 != (int)pbVar5) ||
       (((this->buffer_size_after_limit_ < 1 && (this->total_bytes_read_ != this->current_limit_))
        || (this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_))))
    {
      uVar1 = ReadTagSlow(this);
      return uVar1;
    }
    this->legitimate_message_end_ = true;
  }
  else {
    uVar4 = *pbVar5 & 0x7f;
    if ((char)*pbVar5 < '\0') {
      uVar4 = uVar4 | (pbVar5[1] & 0x7f) << 7;
      if ((char)pbVar5[1] < '\0') {
        uVar4 = uVar4 | (pbVar5[2] & 0x7f) << 0xe;
        if ((char)pbVar5[2] < '\0') {
          uVar4 = uVar4 | (pbVar5[3] & 0x7f) << 0x15;
          if ((char)pbVar5[3] < '\0') {
            uVar4 = uVar4 | (uint)pbVar5[4] << 0x1c;
            if ((char)pbVar5[4] < '\0') {
              pbVar5 = pbVar5 + 6;
              iVar2 = 5;
              do {
                if (-1 < (char)pbVar5[-1]) goto LAB_0016e235;
                pbVar5 = pbVar5 + 1;
                iVar2 = iVar2 + -1;
              } while (iVar2 != 0);
              pbVar5 = (byte *)0x0;
            }
            else {
              pbVar5 = pbVar5 + 5;
            }
          }
          else {
            pbVar5 = pbVar5 + 4;
          }
        }
        else {
          pbVar5 = pbVar5 + 3;
        }
      }
      else {
        pbVar5 = pbVar5 + 2;
      }
    }
    else {
      pbVar5 = pbVar5 + 1;
    }
LAB_0016e235:
    if (pbVar5 != (byte *)0x0) {
      this->buffer_ = pbVar5;
      return uVar4;
    }
  }
  return 0;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return buffer_end_ - buffer_;
}